

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp.c
# Opt level: O0

MPP_RET vdpp_control(VdppCtx ictx,VdppCmd cmd,void *iparam)

{
  MPP_RET MVar1;
  vdpp_api_params *param;
  MPP_RET ret;
  vdpp_api_ctx *ctx;
  void *iparam_local;
  VdppCmd cmd_local;
  VdppCtx ictx_local;
  
  param._4_4_ = MPP_OK;
  if (((iparam == (void *)0x0) && (cmd != VDPP_CMD_RUN_SYNC)) || (ictx == (VdppCtx)0x0)) {
    _mpp_log_l(2,"vdpp","found NULL iparam %p cmd %d ctx %p\n","vdpp_control",iparam,(ulong)cmd,ictx
              );
    ictx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if (cmd == VDPP_CMD_SET_SRC) {
      set_addr((vdpp_addr *)((long)ictx + 0x24),(VdppImg *)iparam);
    }
    else if (cmd == VDPP_CMD_SET_DST) {
      set_addr((vdpp_addr *)((long)ictx + 0x30),(VdppImg *)iparam);
    }
    else if (((cmd == VDPP_CMD_SET_COM_CFG) || (cmd == VDPP_CMD_SET_DMSR_CFG)) ||
            (cmd - VDPP_CMD_SET_ZME_COM_CFG < 2)) {
      param._4_4_ = vdpp_set_param((vdpp_api_ctx *)ictx,(vdpp_api_content *)((long)iparam + 8),
                                   *iparam);
      if (param._4_4_ != MPP_OK) {
        _mpp_log_l(2,"vdpp","set vdpp parameter failed, type %d\n","vdpp_control",(ulong)*iparam);
      }
    }
    else if (cmd == VDPP_CMD_RUN_SYNC) {
      MVar1 = vdpp_start((vdpp_api_ctx *)ictx);
      if (MVar1 != MPP_OK) {
        _mpp_log_l(2,"vdpp","run vdpp failed\n","vdpp_control");
        return MPP_NOK;
      }
      vdpp_wait((vdpp_api_ctx *)ictx);
      vdpp_done((vdpp_api_ctx *)ictx);
      param._4_4_ = MPP_OK;
    }
    ictx_local._4_4_ = param._4_4_;
  }
  return ictx_local._4_4_;
}

Assistant:

MPP_RET vdpp_control(VdppCtx ictx, VdppCmd cmd, void *iparam)
{
    struct vdpp_api_ctx *ctx = ictx;
    MPP_RET ret = MPP_OK;

    if ((NULL == iparam && VDPP_CMD_RUN_SYNC != cmd) ||
        (NULL == ictx)) {
        mpp_err_f("found NULL iparam %p cmd %d ctx %p\n", iparam, cmd, ictx);
        return MPP_ERR_NULL_PTR;
    }

    switch (cmd) {
    case VDPP_CMD_SET_COM_CFG:
    case VDPP_CMD_SET_DMSR_CFG:
    case VDPP_CMD_SET_ZME_COM_CFG:
    case VDPP_CMD_SET_ZME_COEFF_CFG: {
        struct vdpp_api_params *param = (struct vdpp_api_params *)iparam;

        ret = vdpp_set_param(ctx, &param->param, param->ptype);
        if (ret) {
            mpp_err_f("set vdpp parameter failed, type %d\n", param->ptype);
        }
        break;
    }
    case VDPP_CMD_SET_SRC:
        set_addr(&ctx->params.src, (VdppImg *)iparam);
        break;
    case VDPP_CMD_SET_DST:
        set_addr(&ctx->params.dst, (VdppImg *)iparam);
        break;
    case VDPP_CMD_RUN_SYNC:
        ret = vdpp_start(ctx);
        if (ret) {
            mpp_err_f("run vdpp failed\n");
            return MPP_NOK;
        }

        vdpp_wait(ctx);
        vdpp_done(ctx);
        break;
    default:
        ;
    }

    return ret;
}